

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O3

int muduo::ProcessInfo::numThreads(void)

{
  int iVar1;
  long lVar2;
  string status;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  procStatus_abi_cxx11_();
  iVar1 = 0;
  lVar2 = std::__cxx11::string::find((char *)local_30,0x11e7e3,0);
  if (lVar2 != -1) {
    iVar1 = atoi(local_30[0] + lVar2 + 8);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return iVar1;
}

Assistant:

int ProcessInfo::numThreads()
{
  int result = 0;
  string status = procStatus();
  size_t pos = status.find("Threads:");
  if (pos != string::npos)
  {
    result = ::atoi(status.c_str() + pos + 8);
  }
  return result;
}